

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::to_map(Tree *this,size_t node,csubstr key,type_bits more_flags)

{
  csubstr *pcVar1;
  ulong uVar2;
  NodeData *pNVar3;
  code *pcVar4;
  Location LVar5;
  undefined1 auVar6 [24];
  Location LVar7;
  bool bVar8;
  size_t sVar9;
  char msg [37];
  char local_c8 [72];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar8 = has_children(this,node);
  if (bVar8) {
    builtin_strncpy(local_c8,"check failed: (! has_children(node))",0x25);
    if ((s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_58 = 0;
    uStack_50 = 0x67d8;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x67d8) << 0x40);
    LVar5.name.str._0_4_ = 0x24a71d;
    LVar5.super_LineCol.offset = auVar6._0_8_;
    LVar5.super_LineCol.line = auVar6._8_8_;
    LVar5.super_LineCol.col = auVar6._16_8_;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_c8,0x25,LVar5,(this->m_callbacks).m_user_data);
  }
  sVar9 = parent(this,node);
  if (sVar9 != 0xffffffffffffffff) {
    bVar8 = has_parent(this,node);
    if (!bVar8) {
      if ((s_error_flags & 1) != 0) {
        bVar8 = is_debugger_attached();
        if (bVar8) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_c8[0] = '\0';
      local_c8[1] = '\0';
      local_c8[2] = '\0';
      local_c8[3] = '\0';
      local_c8[4] = '\0';
      local_c8[5] = '\0';
      local_c8[6] = '\0';
      local_c8[7] = '\0';
      local_c8[8] = -0x15;
      local_c8[9] = 'K';
      local_c8[10] = '\0';
      local_c8[0xb] = '\0';
      local_c8[0xc] = '\0';
      local_c8[0xd] = '\0';
      local_c8[0xe] = '\0';
      local_c8[0xf] = '\0';
      local_c8[0x10] = '\0';
      local_c8[0x11] = '\0';
      local_c8[0x12] = '\0';
      local_c8[0x13] = '\0';
      local_c8[0x14] = '\0';
      local_c8[0x15] = '\0';
      local_c8[0x16] = '\0';
      local_c8[0x17] = '\0';
      local_c8[0x18] = '\x1d';
      local_c8[0x19] = -0x59;
      local_c8[0x1a] = '$';
      local_c8[0x1b] = '\0';
      local_c8[0x1c] = '\0';
      local_c8[0x1d] = '\0';
      local_c8[0x1e] = '\0';
      local_c8[0x1f] = '\0';
      local_c8[0x20] = 'e';
      local_c8[0x21] = '\0';
      local_c8[0x22] = '\0';
      local_c8[0x23] = '\0';
      local_c8[0x24] = '\0';
      local_c8[0x25] = '\0';
      local_c8[0x26] = '\0';
      local_c8[0x27] = '\0';
      (*(code *)PTR_error_impl_0029b798)
                ("check failed: has_parent(node)",0x1e,(anonymous_namespace)::s_default_callbacks);
    }
    if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
      if ((s_error_flags & 1) != 0) {
        bVar8 = is_debugger_attached();
        if (bVar8) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_c8[0] = '\0';
      local_c8[1] = '\0';
      local_c8[2] = '\0';
      local_c8[3] = '\0';
      local_c8[4] = '\0';
      local_c8[5] = '\0';
      local_c8[6] = '\0';
      local_c8[7] = '\0';
      local_c8[8] = -0x7a;
      local_c8[9] = 'K';
      local_c8[10] = '\0';
      local_c8[0xb] = '\0';
      local_c8[0xc] = '\0';
      local_c8[0xd] = '\0';
      local_c8[0xe] = '\0';
      local_c8[0xf] = '\0';
      local_c8[0x10] = '\0';
      local_c8[0x11] = '\0';
      local_c8[0x12] = '\0';
      local_c8[0x13] = '\0';
      local_c8[0x14] = '\0';
      local_c8[0x15] = '\0';
      local_c8[0x16] = '\0';
      local_c8[0x17] = '\0';
      local_c8[0x18] = '\x1d';
      local_c8[0x19] = -0x59;
      local_c8[0x1a] = '$';
      local_c8[0x1b] = '\0';
      local_c8[0x1c] = '\0';
      local_c8[0x1d] = '\0';
      local_c8[0x1e] = '\0';
      local_c8[0x1f] = '\0';
      local_c8[0x20] = 'e';
      local_c8[0x21] = '\0';
      local_c8[0x22] = '\0';
      local_c8[0x23] = '\0';
      local_c8[0x24] = '\0';
      local_c8[0x25] = '\0';
      local_c8[0x26] = '\0';
      local_c8[0x27] = '\0';
      (*(code *)PTR_error_impl_0029b798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    uVar2 = this->m_buf[node].m_parent;
    if ((uVar2 == 0xffffffffffffffff) || (this->m_cap <= uVar2)) {
      if ((s_error_flags & 1) != 0) {
        bVar8 = is_debugger_attached();
        if (bVar8) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_c8[0] = '\0';
      local_c8[1] = '\0';
      local_c8[2] = '\0';
      local_c8[3] = '\0';
      local_c8[4] = '\0';
      local_c8[5] = '\0';
      local_c8[6] = '\0';
      local_c8[7] = '\0';
      local_c8[8] = -0x7a;
      local_c8[9] = 'K';
      local_c8[10] = '\0';
      local_c8[0xb] = '\0';
      local_c8[0xc] = '\0';
      local_c8[0xd] = '\0';
      local_c8[0xe] = '\0';
      local_c8[0xf] = '\0';
      local_c8[0x10] = '\0';
      local_c8[0x11] = '\0';
      local_c8[0x12] = '\0';
      local_c8[0x13] = '\0';
      local_c8[0x14] = '\0';
      local_c8[0x15] = '\0';
      local_c8[0x16] = '\0';
      local_c8[0x17] = '\0';
      local_c8[0x18] = '\x1d';
      local_c8[0x19] = -0x59;
      local_c8[0x1a] = '$';
      local_c8[0x1b] = '\0';
      local_c8[0x1c] = '\0';
      local_c8[0x1d] = '\0';
      local_c8[0x1e] = '\0';
      local_c8[0x1f] = '\0';
      local_c8[0x20] = 'e';
      local_c8[0x21] = '\0';
      local_c8[0x22] = '\0';
      local_c8[0x23] = '\0';
      local_c8[0x24] = '\0';
      local_c8[0x25] = '\0';
      local_c8[0x26] = '\0';
      local_c8[0x27] = '\0';
      (*(code *)PTR_error_impl_0029b798)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[uVar2].m_type.type & MAP) == NOTYPE) {
      builtin_strncpy(local_c8 + 0x30,"_map(node))",0xc);
      builtin_strncpy(local_c8 + 0x20,"ONE || parent_is",0x10);
      builtin_strncpy(local_c8 + 0x10,"arent(node) == N",0x10);
      builtin_strncpy(local_c8,"check failed: (p",0x10);
      if ((s_error_flags & 1) != 0) {
        bVar8 = is_debugger_attached();
        if (bVar8) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_80 = 0;
      uStack_78 = 0x67d9;
      local_70 = 0;
      pcStack_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x65;
      auVar6 = ZEXT1224(ZEXT412(0x67d9) << 0x40);
      LVar7.name.str._0_4_ = 0x24a71d;
      LVar7.super_LineCol.offset = auVar6._0_8_;
      LVar7.super_LineCol.line = auVar6._8_8_;
      LVar7.super_LineCol.col = auVar6._16_8_;
      LVar7.name.str._4_4_ = 0;
      LVar7.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_c8,0x3c,LVar7,(this->m_callbacks).m_user_data);
    }
  }
  _check_next_flags(this,node,more_flags | KEYMAP);
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_c8[0] = '\0';
    local_c8[1] = '\0';
    local_c8[2] = '\0';
    local_c8[3] = '\0';
    local_c8[4] = '\0';
    local_c8[5] = '\0';
    local_c8[6] = '\0';
    local_c8[7] = '\0';
    local_c8[8] = -0x7d;
    local_c8[9] = 'K';
    local_c8[10] = '\0';
    local_c8[0xb] = '\0';
    local_c8[0xc] = '\0';
    local_c8[0xd] = '\0';
    local_c8[0xe] = '\0';
    local_c8[0xf] = '\0';
    local_c8[0x10] = '\0';
    local_c8[0x11] = '\0';
    local_c8[0x12] = '\0';
    local_c8[0x13] = '\0';
    local_c8[0x14] = '\0';
    local_c8[0x15] = '\0';
    local_c8[0x16] = '\0';
    local_c8[0x17] = '\0';
    local_c8[0x18] = '\x1d';
    local_c8[0x19] = -0x59;
    local_c8[0x1a] = '$';
    local_c8[0x1b] = '\0';
    local_c8[0x1c] = '\0';
    local_c8[0x1d] = '\0';
    local_c8[0x1e] = '\0';
    local_c8[0x1f] = '\0';
    local_c8[0x20] = 'e';
    local_c8[0x21] = '\0';
    local_c8[0x22] = '\0';
    local_c8[0x23] = '\0';
    local_c8[0x24] = '\0';
    local_c8[0x25] = '\0';
    local_c8[0x26] = '\0';
    local_c8[0x27] = '\0';
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  this->m_buf[node].m_type.type = more_flags | KEYMAP;
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_c8[0] = '\0';
    local_c8[1] = '\0';
    local_c8[2] = '\0';
    local_c8[3] = '\0';
    local_c8[4] = '\0';
    local_c8[5] = '\0';
    local_c8[6] = '\0';
    local_c8[7] = '\0';
    local_c8[8] = -0x7d;
    local_c8[9] = 'K';
    local_c8[10] = '\0';
    local_c8[0xb] = '\0';
    local_c8[0xc] = '\0';
    local_c8[0xd] = '\0';
    local_c8[0xe] = '\0';
    local_c8[0xf] = '\0';
    local_c8[0x10] = '\0';
    local_c8[0x11] = '\0';
    local_c8[0x12] = '\0';
    local_c8[0x13] = '\0';
    local_c8[0x14] = '\0';
    local_c8[0x15] = '\0';
    local_c8[0x16] = '\0';
    local_c8[0x17] = '\0';
    local_c8[0x18] = '\x1d';
    local_c8[0x19] = -0x59;
    local_c8[0x1a] = '$';
    local_c8[0x1b] = '\0';
    local_c8[0x1c] = '\0';
    local_c8[0x1d] = '\0';
    local_c8[0x1e] = '\0';
    local_c8[0x1f] = '\0';
    local_c8[0x20] = 'e';
    local_c8[0x21] = '\0';
    local_c8[0x22] = '\0';
    local_c8[0x23] = '\0';
    local_c8[0x24] = '\0';
    local_c8[0x25] = '\0';
    local_c8[0x26] = '\0';
    local_c8[0x27] = '\0';
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar3 = this->m_buf;
  pNVar3[node].m_key.tag.str = (char *)0x0;
  pNVar3[node].m_key.tag.len = 0;
  pNVar3[node].m_key.scalar.str = key.str;
  pNVar3[node].m_key.scalar.len = key.len;
  pcVar1 = &pNVar3[node].m_key.anchor;
  pcVar1->str = (char *)0x0;
  pcVar1->len = 0;
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_c8[0] = '\0';
    local_c8[1] = '\0';
    local_c8[2] = '\0';
    local_c8[3] = '\0';
    local_c8[4] = '\0';
    local_c8[5] = '\0';
    local_c8[6] = '\0';
    local_c8[7] = '\0';
    local_c8[8] = -0x7d;
    local_c8[9] = 'K';
    local_c8[10] = '\0';
    local_c8[0xb] = '\0';
    local_c8[0xc] = '\0';
    local_c8[0xd] = '\0';
    local_c8[0xe] = '\0';
    local_c8[0xf] = '\0';
    local_c8[0x10] = '\0';
    local_c8[0x11] = '\0';
    local_c8[0x12] = '\0';
    local_c8[0x13] = '\0';
    local_c8[0x14] = '\0';
    local_c8[0x15] = '\0';
    local_c8[0x16] = '\0';
    local_c8[0x17] = '\0';
    local_c8[0x18] = '\x1d';
    local_c8[0x19] = -0x59;
    local_c8[0x1a] = '$';
    local_c8[0x1b] = '\0';
    local_c8[0x1c] = '\0';
    local_c8[0x1d] = '\0';
    local_c8[0x1e] = '\0';
    local_c8[0x1f] = '\0';
    local_c8[0x20] = 'e';
    local_c8[0x21] = '\0';
    local_c8[0x22] = '\0';
    local_c8[0x23] = '\0';
    local_c8[0x24] = '\0';
    local_c8[0x25] = '\0';
    local_c8[0x26] = '\0';
    local_c8[0x27] = '\0';
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar3 = this->m_buf;
  pcVar1 = &pNVar3[node].m_val.anchor;
  pcVar1->str = (char *)0x0;
  pcVar1->len = 0;
  pcVar1 = &pNVar3[node].m_val.scalar;
  pcVar1->str = (char *)0x0;
  pcVar1->len = 0;
  pNVar3[node].m_val.tag.str = (char *)0x0;
  pNVar3[node].m_val.tag.len = 0;
  return;
}

Assistant:

void Tree::to_map(size_t node, csubstr key, type_bits more_flags)
{
    _RYML_CB_ASSERT(m_callbacks,  ! has_children(node));
    _RYML_CB_ASSERT(m_callbacks, parent(node) == NONE || parent_is_map(node));
    _set_flags(node, KEY|MAP|more_flags);
    _p(node)->m_key = key;
    _p(node)->m_val.clear();
}